

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O2

int __thiscall ktx::CommandEncode::main(CommandEncode *this,int argc,char **argv)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ktx encode",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Encode the KTX file specified as the input-file argument,\n    optionally supercompress the result, and save it as the output-file."
             ,&local_62);
  Command::parseCommandLine(&this->super_Command,&local_60,&local_40,argc,argv);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  executeEncode(this);
  return 0;
}

Assistant:

int CommandEncode::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx encode",
                "Encode the KTX file specified as the input-file argument,\n"
                "    optionally supercompress the result, and save it as the output-file.",
                argc, argv);
        executeEncode();
        return +rc::SUCCESS;
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}